

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

bool P_AlignFlat(int linenum,int side,int fc)

{
  double dVar1;
  line_t *plVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  plVar2 = lines + linenum;
  dVar1 = plVar2->bbox[(ulong)(side != 0) + 4];
  if (dVar1 != 0.0) {
    dVar3 = c_atan2((plVar2->delta).Y,(plVar2->delta).X);
    dVar3 = dVar3 * 57.29577951308232;
    dVar4 = FFastTrig::cos(&fasttrig,dVar3);
    dVar4 = dVar4 * (plVar2->v1->p).X;
    dVar5 = FFastTrig::sin(&fasttrig,dVar4);
    dVar4 = dVar5 * (plVar2->v1->p).Y + dVar4;
    if (side == 0) {
      dVar4 = -dVar4;
    }
    else {
      dVar3 = dVar3 + 180.0;
    }
    *(double *)((long)dVar1 + 0x10 + (long)fc * 0x58) = dVar4;
    *(double *)((long)dVar1 + 0x30 + (long)fc * 0x58) = -dVar3;
  }
  return dVar1 != 0.0;
}

Assistant:

bool P_AlignFlat (int linenum, int side, int fc)
{
	line_t *line = lines + linenum;
	sector_t *sec = side ? line->backsector : line->frontsector;

	if (!sec)
		return false;

	DAngle angle = line->Delta().Angle();
	DAngle norm = angle - 90;
	double dist = -(norm.Cos() * line->v1->fX() + norm.Sin() * line->v1->fY());

	if (side)
	{
		angle += 180.;
		dist = -dist;
	}

	sec->SetBase(fc, dist, -angle);
	return true;
}